

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O0

void pkg_deleteList(CharList *l)

{
  _CharList *p_Var1;
  CharList *tmp;
  CharList *l_local;
  
  tmp = l;
  while (tmp != (CharList *)0x0) {
    uprv_free_63(tmp->str);
    p_Var1 = tmp->next;
    uprv_free_63(tmp);
    tmp = p_Var1;
  }
  return;
}

Assistant:

void pkg_deleteList(CharList *l)
{
  CharList *tmp;
  while(l != NULL)
  {
    uprv_free((void*)l->str);
    tmp = l;
    l = l->next;
    uprv_free(tmp);
  }
}